

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.hpp
# Opt level: O1

float * __thiscall openjij::graph::Sparse<float>::h(Sparse<float> *this,Index i)

{
  const_iterator cVar1;
  key_type local_10;
  
  if ((this->super_Graph)._num_spins <= i) {
    __assert_fail("i < get_num_spins()",
                  "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/include/openjij/graph/sparse.hpp"
                  ,0x13a,
                  "const FloatType &openjij::graph::Sparse<float>::h(Index) const [FloatType = float]"
                 );
  }
  local_10.first = i;
  local_10.second = i;
  cVar1 = std::
          _Hashtable<std::pair<unsigned_long,_unsigned_long>,_std::pair<const_std::pair<unsigned_long,_unsigned_long>,_float>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_float>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_long,_unsigned_long>_>,_openjij::utility::PairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->_J)._M_h,&local_10);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_float>,_true>
      ._M_cur != (__node_type *)0x0) {
    return (float *)((long)cVar1.
                           super__Node_iterator_base<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_float>,_true>
                           ._M_cur + 0x18);
  }
  std::__throw_out_of_range("_Map_base::at");
}

Assistant:

const FloatType &h(Index i) const {
    assert(i < get_num_spins());
    return _J.at(std::make_pair(i, i));
  }